

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double analyze(vector<double,_std::allocator<double>_> *values)

{
  allocator<double> *this;
  double dVar1;
  const_iterator __first;
  const_iterator __last;
  size_type sVar2;
  double dVar3;
  const_reference pvVar4;
  reference pvVar5;
  iterator __first_00;
  iterator __last_00;
  long lVar6;
  ostream *poVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong local_e0;
  size_t i_1;
  int n;
  double range;
  size_t i;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> dsqrs;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> diffs;
  allocator<bool> local_5a;
  bool local_59;
  undefined1 local_58 [8];
  vector<bool,_std::allocator<bool>_> excluded;
  double average;
  double sum;
  vector<double,_std::allocator<double>_> *values_local;
  
  __first = std::vector<double,_std::allocator<double>_>::begin(values);
  __last = std::vector<double,_std::allocator<double>_>::end(values);
  dVar8 = std::
          accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__last._M_current,0.0);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (_Bit_pointer)
       (dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  local_59 = false;
  std::allocator<bool>::allocator(&local_5a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_58,sVar2,&local_59,&local_5a);
  std::allocator<bool>::~allocator(&local_5a);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  this = (allocator<double> *)
         ((long)&dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,sVar2,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,sVar2,
             (allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  for (range = 0.0; dVar3 = (double)std::vector<double,_std::allocator<double>_>::size(values),
      (ulong)range < (ulong)dVar3; range = (double)((long)range + 1)) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](values,(size_type)range);
    dVar3 = *pvVar4 - (double)excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(size_type)range);
    *pvVar5 = dVar3;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(size_type)range);
    dVar3 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(size_type)range);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a8,(size_type)range);
    *pvVar5 = dVar3 * dVar1;
  }
  __first_00 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_a8);
  __last_00 = std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)local_a8);
  dVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first_00._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __last_00._M_current,0.0);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  lVar6 = sVar2 - 1;
  auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  dVar3 = sqrt(dVar3 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)));
  poVar7 = std::operator<<((ostream *)&std::cerr,"sum: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cerr,"size: ");
  sVar2 = std::vector<double,_std::allocator<double>_>::size(values);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar2);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cerr,"average: ");
  poVar7 = (ostream *)
           std::ostream::operator<<
                     (poVar7,(double)excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cerr,"range: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar3);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cerr,"range/average: ");
  poVar7 = (ostream *)
           std::ostream::operator<<
                     (poVar7,dVar3 / (double)excluded.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  for (local_e0 = 0; sVar2 = std::vector<double,_std::allocator<double>_>::size(values),
      local_e0 < sVar2; local_e0 = local_e0 + 1) {
    dVar8 = (double)excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage - dVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](values,local_e0);
    if (dVar8 < *pvVar4) {
      std::vector<double,_std::allocator<double>_>::operator[](values,local_e0);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_58)
  ;
  return dVar3;
}

Assistant:

double analyze(const std::vector<double>& values)
{
    double sum = std::accumulate(values.begin(), values.end(), 0.0);
    double average = sum/values.size();
    std::vector<bool> excluded(values.size(), false);

    std::vector<double> diffs(values.size());
    std::vector<double> dsqrs(values.size());
    for (size_t i = 0; i < values.size(); i++)
    {
        diffs[i] = values[i] - average;
        dsqrs[i] = diffs[i]*diffs[i];
    }
    double range = sqrt(std::accumulate(dsqrs.begin(), dsqrs.end(), 0.0)/(values.size() -1));

    int n = 0;
    std::cerr << "sum: " << sum << std::endl;
    std::cerr << "size: " << values.size() << std::endl;
    std::cerr << "average: " << average << std::endl;
    std::cerr << "range: " << range << std::endl;
    std::cerr << "range/average: " << range/average << std::endl;
    std::cerr << std::endl;
    for (size_t i = 0; i < values.size(); i++)
    {
        if (average - range < values[i] && average + range > values[i])
        {
            n++;
        }
    }

    return range;
}